

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

int h264_cabac_bypass(bitstream *str,h264_cabac_context *cabac,uint32_t *binVal)

{
  int iVar1;
  uint local_2c;
  uint32_t *puStack_28;
  uint32_t tmp;
  uint32_t *binVal_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  cabac->codIOffset = cabac->codIOffset << 1;
  puStack_28 = binVal;
  binVal_local = (uint32_t *)cabac;
  cabac_local = (h264_cabac_context *)str;
  if (str->dir == VS_ENCODE) {
    if (*binVal != 0) {
      cabac->codIOffset = cabac->codIRange + cabac->codIOffset;
    }
    if (cabac->codIOffset < 0x200) {
      iVar1 = put_bit(str,cabac,0);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else if (cabac->codIOffset < 0x400) {
      cabac->bitsOutstanding = cabac->bitsOutstanding + 1;
      cabac->codIOffset = cabac->codIOffset - 0x200;
    }
    else {
      iVar1 = put_bit(str,cabac,1);
      if (iVar1 != 0) {
        return 1;
      }
      binVal_local[0x206] = binVal_local[0x206] - 0x400;
    }
  }
  else {
    iVar1 = vs_u(str,&local_2c,1);
    if (iVar1 != 0) {
      return 1;
    }
    binVal_local[0x206] = local_2c | binVal_local[0x206];
    if (binVal_local[0x206] < binVal_local[0x207]) {
      *puStack_28 = 0;
    }
    else {
      *puStack_28 = 1;
      binVal_local[0x206] = binVal_local[0x206] - binVal_local[0x207];
    }
  }
  binVal_local[0x20a] = binVal_local[0x20a] + 1;
  return 0;
}

Assistant:

int h264_cabac_bypass(struct bitstream *str, struct h264_cabac_context *cabac, uint32_t *binVal) {
	cabac->codIOffset <<= 1;
	if (str->dir == VS_ENCODE) {
		if (*binVal)
			cabac->codIOffset += cabac->codIRange;
		if (cabac->codIOffset < 512) {
			if (put_bit(str, cabac, 0))
				return 1;
		} else if (cabac->codIOffset >= 1024) {
			if (put_bit(str, cabac, 1))
				return 1;
			cabac->codIOffset -= 1024;
		} else {
			cabac->bitsOutstanding++;
			cabac->codIOffset -= 512;
		}
	} else {
		uint32_t tmp;
		if (vs_u(str, &tmp, 1))
			return 1;
		cabac->codIOffset |= tmp;
		if (cabac->codIOffset >= cabac->codIRange) {
			*binVal = 1;
			cabac->codIOffset -= cabac->codIRange;
		} else {
			*binVal = 0;
		}
	}
	cabac->BinCount++;
	return 0;
}